

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O3

void __thiscall llama_model::load_arch(llama_model *this,llama_model_loader *ml)

{
  llm_arch lVar1;
  runtime_error *this_00;
  long *plVar2;
  long *plVar3;
  string local_80;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  lVar1 = llama_model_loader::get_arch(ml);
  this->arch = lVar1;
  if (lVar1 != LLM_ARCH_UNKNOWN) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  llama_model_loader::get_arch_name_abi_cxx11_(&local_80,ml);
  std::operator+(&local_40,"unknown model architecture: \'",&local_80);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_60 == plVar3) {
    local_50 = *plVar3;
    lStack_48 = plVar2[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar3;
  }
  local_58 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_60);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void llama_model::load_arch(llama_model_loader & ml) {
    arch = ml.get_arch();
    if (arch == LLM_ARCH_UNKNOWN) {
        throw std::runtime_error("unknown model architecture: '" + ml.get_arch_name() + "'");
    }
}